

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O2

float __thiscall
Opcode::AABBTreeOfTrianglesBuilder::GetSplittingValue
          (AABBTreeOfTrianglesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box,
          udword axis)

{
  udword uVar1;
  MeshInterface *pMVar2;
  IndexedTriangle *pIVar3;
  Point *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  if (((this->super_AABBTreeBuilder).mSettings.mRules & 0x20) == 0) {
    return (&(global_box->mCenter).x)[axis];
  }
  pMVar2 = this->mIMesh;
  uVar5 = (ulong)axis;
  fVar8 = 0.0;
  for (uVar6 = 0; nb_prims != uVar6; uVar6 = uVar6 + 1) {
    uVar7 = (ulong)(pMVar2->mTriStride * primitives[uVar6]);
    pIVar3 = pMVar2->mTris;
    pPVar4 = pMVar2->mVerts;
    uVar1 = pMVar2->mVertexStride;
    fVar8 = fVar8 + *(float *)((long)&pPVar4->x +
                              uVar5 * 4 + (ulong)(*(int *)((long)pIVar3->mVRef + uVar7) * uVar1)) +
            *(float *)((long)&pPVar4->x +
                      uVar5 * 4 + (ulong)(*(int *)((long)pIVar3->mVRef + uVar7 + 4) * uVar1)) +
            *(float *)((long)&pPVar4->x +
                      uVar5 * 4 + (ulong)(uVar1 * *(int *)((long)pIVar3->mVRef + uVar7 + 8)));
  }
  return fVar8 / (float)(nb_prims * 3);
}

Assistant:

float AABBTreeOfTrianglesBuilder::GetSplittingValue(const udword* primitives, udword nb_prims, const AABB& global_box, udword axis)	const
{
	if(mSettings.mRules&SPLIT_GEOM_CENTER)
	{
		// Loop through triangles
		float SplitValue = 0.0f;
		VertexPointers VP;
		for(udword i=0;i<nb_prims;i++)
		{
			// Get current triangle-vertices
			mIMesh->GetTriangle(VP, primitives[i]);
			// Update split value
			SplitValue += (*VP.Vertex[0])[axis];
			SplitValue += (*VP.Vertex[1])[axis];
			SplitValue += (*VP.Vertex[2])[axis];
		}
		return SplitValue / float(nb_prims*3);
	}
	else return AABBTreeBuilder::GetSplittingValue(primitives, nb_prims, global_box, axis);
}